

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

string * pbrt::NormalizeUTF8(string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  allocator<char> *__a;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  utf8proc_ssize_t length;
  utf8proc_uint8_t *result;
  utf8proc_option_t options;
  utf8proc_option_t in_stack_ffffffffffffff5c;
  utf8proc_uint8_t **in_stack_ffffffffffffff60;
  utf8proc_ssize_t in_stack_ffffffffffffff68;
  utf8proc_uint8_t *in_stack_ffffffffffffff70;
  allocator<char> *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char **in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  allocator<char> local_51;
  string local_50 [32];
  char *local_30;
  utf8proc_ssize_t local_28;
  void *local_20;
  undefined4 local_14;
  
  local_14 = 8;
  this = in_RDI;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::data();
  std::__cxx11::string::size();
  local_28 = utf8proc_map(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  if (local_28 < 0) {
    local_30 = utf8proc_errmsg(local_28);
    ErrorExit<char_const*,std::__cxx11::string&>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,args_1);
  }
  __a = (allocator<char> *)((long)local_20 + local_28);
  __end = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<unsigned_char*,void>(this,(uchar *)in_RDI,(uchar *)__end,__a);
  std::__cxx11::string::operator=(in_RSI,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  free(local_20);
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return this;
}

Assistant:

std::string NormalizeUTF8(std::string str) {
    utf8proc_option_t options = UTF8PROC_COMPOSE;

    utf8proc_uint8_t *result;
    utf8proc_ssize_t length =
        utf8proc_map((const unsigned char *)str.data(), str.size(), &result, options);
    if (length < 0)
        ErrorExit("Unicode normalization error: %s: \"%s\"", utf8proc_errmsg(length),
                  str);

    str = std::string(result, result + length);
    free(result);
    return str;
}